

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ExistingFileNamer::getReceivedFile(ExistingFileNamer *this,string *param_2)

{
  long in_RSI;
  string *in_RDI;
  
  ::std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string ExistingFileNamer::getReceivedFile(std::string) const
    {
        return filePath;
    }